

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O2

void __thiscall SimpleParallelAnalyzer::~SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerResults *pSVar1;
  SimpleParallelAnalyzerSettings *pSVar2;
  
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0010bd58;
  Analyzer::KillThread();
  SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  std::vector<Channel,_std::allocator<Channel>_>::~vector(&this->mDataChannels);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&(this->mDataNextEdge).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&(this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            );
  std::_Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::~_Vector_base
            (&(this->mData).
              super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>);
  pSVar1 = (this->mResults)._M_ptr;
  if (pSVar1 != (SimpleParallelAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  pSVar2 = (this->mSettings)._M_ptr;
  if (pSVar2 != (SimpleParallelAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pSVar2 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SimpleParallelAnalyzer::~SimpleParallelAnalyzer()
{
	KillThread();
}